

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O1

void __thiscall
QTextMarkdownImporter::QTextMarkdownImporter
          (QTextMarkdownImporter *this,QTextDocument *doc,Features features)

{
  QTextCursor::QTextCursor(&this->m_cursor,doc);
  (this->m_spanFormatStack).super_QList<QTextCharFormat>.d.ptr = (QTextCharFormat *)0x0;
  (this->m_spanFormatStack).super_QList<QTextCharFormat>.d.size = 0;
  (this->m_listStack).super_QList<QPointer<QTextList>_>.d.size = 0;
  (this->m_spanFormatStack).super_QList<QTextCharFormat>.d.d = (Data *)0x0;
  (this->m_listStack).super_QList<QPointer<QTextList>_>.d.d = (Data *)0x0;
  (this->m_listStack).super_QList<QPointer<QTextList>_>.d.ptr = (QPointer<QTextList> *)0x0;
  (this->m_nonEmptyTableCells).d.ptr = (int *)0x0;
  (this->m_nonEmptyTableCells).d.size = 0;
  (this->m_blockCodeLanguage).d.size = 0;
  (this->m_nonEmptyTableCells).d.d = (Data *)0x0;
  (this->m_blockCodeLanguage).d.d = (Data *)0x0;
  (this->m_blockCodeLanguage).d.ptr = (char16_t *)0x0;
  (this->m_htmlAccumulator).d.ptr = (char16_t *)0x0;
  (this->m_htmlAccumulator).d.size = 0;
  this->m_currentTable = (QTextTable *)0x0;
  (this->m_htmlAccumulator).d.d = (Data *)0x0;
  QFontDatabase::systemFont((QFontDatabase *)&this->m_monoFont,FixedFont);
  QPalette::QPalette(&this->m_palette);
  this->m_htmlTagDepth = 0;
  this->m_blockQuoteDepth = 0;
  this->m_tableColumnCount = 0;
  this->m_tableRowCount = 0;
  this->m_tableCol = -1;
  this->m_paragraphMargin = 0;
  this->m_blockType = 0;
  this->m_blockCodeFence = '\0';
  (this->m_features).super_QFlagsStorageHelper<QTextMarkdownImporter::Feature,_4>.
  super_QFlagsStorage<QTextMarkdownImporter::Feature>.i =
       (Int)features.super_QFlagsStorageHelper<QTextMarkdownImporter::Feature,_4>.
            super_QFlagsStorage<QTextMarkdownImporter::Feature>.i;
  QTextImageFormat::QTextImageFormat(&this->m_imageFormat);
  QTextListFormat::QTextListFormat(&this->m_listFormat);
  this->m_imageSpan = false;
  this->m_markerType = NoMarker;
  this->m_needsInsertBlock = false;
  this->m_needsInsertList = false;
  this->m_listItem = false;
  this->m_codeBlock = false;
  return;
}

Assistant:

QTextMarkdownImporter::QTextMarkdownImporter(QTextDocument *doc, QTextMarkdownImporter::Features features)
  : m_cursor(doc)
  , m_monoFont(QFontDatabase::systemFont(QFontDatabase::FixedFont))
  , m_features(features)
{
}